

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::rescaleVar(Projection *this,MultiFab *sig,int param_3,MultiFab *vel,int level)

{
  bool bVar1;
  Geometry *this_00;
  FabArray<amrex::FArrayBox> *in_RSI;
  Array4<double> *sigarr;
  Box *bx;
  MFIter mfi;
  int domhiy;
  int domhix;
  int domloy;
  int domlox;
  Box *domain;
  int in_stack_fffffffffffffe8c;
  AmrMesh *in_stack_fffffffffffffe90;
  FabArray<amrex::FArrayBox> *this_01;
  undefined1 auStack_150 [7];
  undefined1 in_stack_fffffffffffffeb7;
  FabArrayBase *in_stack_fffffffffffffeb8;
  MFIter *in_stack_fffffffffffffec0;
  anon_class_80_5_89e139ba *in_stack_fffffffffffffed0;
  Box *in_stack_fffffffffffffed8;
  undefined1 local_110 [12];
  int in_stack_fffffffffffffefc;
  MFIter *in_stack_ffffffffffffff00;
  undefined1 local_c4 [132];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Box *local_30;
  FabArray<amrex::FArrayBox> *local_10;
  
  local_10 = in_RSI;
  this_00 = amrex::AmrMesh::Geom(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  local_30 = amrex::Geometry::Domain(this_00);
  local_34 = amrex::Box::smallEnd(local_30,0);
  local_38 = amrex::Box::smallEnd(local_30,1);
  local_3c = amrex::Box::bigEnd(local_30,0);
  local_40 = amrex::Box::bigEnd(local_30,1);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7);
  this_01 = local_10;
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_c4 + 0x24));
    if (!bVar1) break;
    amrex::MFIter::growntilebox(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    local_c4._28_8_ = local_c4;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_01,(MFIter *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe90 = (AmrMesh *)local_c4._28_8_;
    memcpy(auStack_150,local_110,0x3c);
    amrex::ParallelFor<Projection::rescaleVar(amrex::MultiFab*,int,amrex::MultiFab*,int)::__0>
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    amrex::MFIter::operator++((MFIter *)(local_c4 + 0x24));
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void
Projection::rescaleVar (MultiFab*       sig,
                        int             /*sig_nghosts*/,
                        MultiFab*       vel,
                        int             level)
{
    AMREX_ASSERT(sig->nComp() == 1);
    AMREX_ASSERT(vel->nComp() >= AMREX_SPACEDIM);

    const Box& domain  = parent->Geom(level).Domain();
    const int  domlox  = domain.smallEnd(0);
    const int  domloy  = domain.smallEnd(1);
    const int  domhix  = domain.bigEnd(0);
    const int  domhiy  = domain.bigEnd(1);

#if (AMREX_SPACEDIM  == 2)

    if (parent->Geom(0).IsRZ())
    {
        //
        // Divide sigma and vel by a radius for r-z coordinates.
        // Invert sigma to return to original form
        //
	const Real dxr     = parent->Geom(level).CellSize()[0];

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // Don't think we need this check for small sigma since RZ
	      // doesn't work with EB in MLNodeLap. The concern is covered vals == 0
	      // if ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue ) ?
	      sigarr(i,j,k) = (static_cast<Real>(i)+ Real(0.5))*dxr/sigarr(i,j,k);
	      // : sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to bogus_value
	      sigarr(i,j,k) = BogusValue;
	    }
	  });

	  auto const& velarr = vel->array(mfi);

	  amrex::ParallelFor(bx, AMREX_SPACEDIM, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      velarr(i,j,k,n) /= (static_cast<Real>(i)+ Real(0.5))*dxr;
	    }
	    else
	    {
	      // set vals outside the domain
	      velarr(i,j,k,n) = BogusValue;
	    }
	  });
	}
    }
    else
#endif
    {
        //
        // Invert sigma
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // The conern here is EB covered cells set to zero
	      sigarr(i,j,k) = ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue )
		? Real(1.0)/sigarr(i,j,k)
		: sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to
	      sigarr(i,j,k) = BogusValue;
	    }
	  });
	}
    }
}